

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

Vec_Ptr_t * Saig_ManDetectConstrCheckCont(Vec_Ptr_t *vSuper,Vec_Ptr_t *vSuper2)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  if ((long)vSuper2->nSize < 1) {
    uVar5 = (ulong)(uint)vSuper->nSize;
  }
  else {
    uVar5 = (ulong)(uint)vSuper->nSize;
    if (vSuper->nSize < 1) {
      return (Vec_Ptr_t *)0x0;
    }
    lVar7 = 0;
    do {
      uVar8 = 0;
      while (vSuper->pArray[uVar8] != vSuper2->pArray[lVar7]) {
        uVar8 = uVar8 + 1;
        if (uVar5 == uVar8) {
          return (Vec_Ptr_t *)0x0;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != vSuper2->nSize);
  }
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  if (0 < (int)uVar5) {
    iVar9 = 0;
    uVar8 = 100;
    lVar7 = 0;
    do {
      pvVar1 = vSuper->pArray[lVar7];
      if (0 < (long)vSuper2->nSize) {
        lVar4 = 0;
        do {
          if (vSuper2->pArray[lVar4] == pvVar1) goto LAB_006e0890;
          lVar4 = lVar4 + 1;
        } while (vSuper2->nSize != lVar4);
      }
      iVar6 = (int)uVar8;
      if (iVar9 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar8 = 0x10;
        }
        else {
          uVar8 = (ulong)(uint)(iVar6 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar8 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar8 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      lVar4 = (long)iVar9;
      iVar9 = iVar9 + 1;
      pVVar2->nSize = iVar9;
      ppvVar3[lVar4] = pvVar1;
      uVar5 = (ulong)(uint)vSuper->nSize;
LAB_006e0890:
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)uVar5);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Saig_ManDetectConstrCheckCont( Vec_Ptr_t * vSuper, Vec_Ptr_t * vSuper2 )
{
    Vec_Ptr_t * vUnique;
    Aig_Obj_t * pObj, * pObj2;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper2, pObj2, i )
        if ( Vec_PtrFind( vSuper, pObj2 ) == -1 )
            return 0;
    vUnique = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            Vec_PtrPush( vUnique, pObj );
    return vUnique;
}